

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O0

int __thiscall CMKDCommand::doWhat(CMKDCommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  char *pcVar3;
  allocator local_1109;
  undefined1 local_1108 [8];
  string ret_2;
  undefined1 local_10e0 [8];
  string ret_1;
  allocator local_10a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1088;
  undefined1 local_1068 [8];
  string ret;
  char buffer [4096];
  string local_40;
  CClient *local_20;
  CClient *pClient_local;
  CMKDCommand *this_local;
  
  local_20 = pClient;
  pClient_local = (CClient *)this;
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_1108,"530 Please login with USER and PASS.\r\n",&local_1109);
    std::allocator<char>::~allocator((allocator<char> *)&local_1109);
    CClient::sendMsg(local_20,(string *)local_1108);
    this_local._4_4_ = -1;
    std::__cxx11::string::~string((string *)local_1108);
  }
  else {
    CClient::GetUserDir_abi_cxx11_(&local_40,local_20);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    chdir(pcVar3);
    std::__cxx11::string::~string((string *)&local_40);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = mkdir(pcVar3,0x1fd);
    if (iVar2 == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      chdir(pcVar3);
      pcVar3 = ret.field_2._M_local_buf + 8;
      bzero(pcVar3,0x1000);
      getcwd(pcVar3,0x1000);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_10a8,pcVar3,&local_10a9);
      std::operator+(&local_1088,"257 \"",&local_10a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1068
                     ,&local_1088,"\" created.\r\n");
      std::__cxx11::string::~string((string *)&local_1088);
      std::__cxx11::string::~string((string *)&local_10a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_10a9);
      CClient::sendMsg(local_20,(string *)local_1068);
      this_local._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_1068);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_10e0,"550 Create directory operation failed.\r\n",
                 (allocator *)(ret_2.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(ret_2.field_2._M_local_buf + 0xf));
      CClient::sendMsg(local_20,(string *)local_10e0);
      this_local._4_4_ = -1;
      std::__cxx11::string::~string((string *)local_10e0);
    }
  }
  return this_local._4_4_;
}

Assistant:

int CMKDCommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        chdir(pClient->GetUserDir().c_str());
        if(0 == mkdir(m_Args.c_str(), S_IRWXU | S_IRWXG | S_IROTH | S_IXOTH)){
            chdir(m_Args.c_str());
            char buffer[BUFFER_SIZE];
            bzero(buffer,BUFFER_SIZE);
            getcwd(buffer,BUFFER_SIZE);
            string ret = "257 \"" + string(buffer) + "\" created.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        else {
            string ret = "550 Create directory operation failed.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}